

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O0

void __thiscall wasm::DataFlow::Node::addValue(Node *this,Node *value)

{
  Node *local_18;
  Node *value_local;
  Node *this_local;
  
  local_18 = value;
  value_local = this;
  std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::push_back
            (&this->values,&local_18);
  return;
}

Assistant:

void addValue(Node* value) { values.push_back(value); }